

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph_test.cc
# Opt level: O2

Test * GraphTestDyndepFileError::Create(void)

{
  Test *this;
  
  this = (Test *)operator_new(0x228);
  GraphTestDyndepFileError((GraphTestDyndepFileError *)this);
  g_current_test = this;
  return this;
}

Assistant:

TEST_F(GraphTest, DyndepFileError) {
  AssertParse(&state_,
"rule r\n"
"  command = unused\n"
"build out: r || dd\n"
"  dyndep = dd\n"
  );
  fs_.Create("dd",
"ninja_dyndep_version = 1\n"
  );

  string err;
  EXPECT_FALSE(scan_.RecomputeDirty(GetNode("out"), &err));
  ASSERT_EQ("'out' not mentioned in its dyndep file 'dd'", err);
}